

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::~MemoryOutputStream
          (MemoryOutputStream *this)

{
  StringOutputStream *pSVar1;
  GeneratorContextImpl *pGVar2;
  size_type sVar3;
  int iVar4;
  ostream *poVar5;
  reference ppVar6;
  ulong uVar7;
  long lVar8;
  Nonnull<const_char_*> failure_msg;
  ulong uVar9;
  size_t insertion_length;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  ulong uVar12;
  size_type sVar13;
  pointer pcVar14;
  size_t in_R9;
  pointer pcVar15;
  string *insertion_content;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  string_view format;
  string indent_;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  it;
  string magic_string;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_bool>
  pair;
  long *local_e8;
  pointer local_e0;
  long local_d8 [3];
  string *local_c0;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  LogMessageFatal local_58;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_bool>
  local_48;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__MemoryOutputStream_0190bbb8;
  pSVar1 = (this->inner_)._M_t.
           super___uniq_ptr_impl<google::protobuf::io::StringOutputStream,_std::default_delete<google::protobuf::io::StringOutputStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::io::StringOutputStream_*,_std::default_delete<google::protobuf::io::StringOutputStream>_>
           .super__Head_base<0UL,_google::protobuf::io::StringOutputStream_*,_false>._M_head_impl;
  (this->inner_)._M_t.
  super___uniq_ptr_impl<google::protobuf::io::StringOutputStream,_std::default_delete<google::protobuf::io::StringOutputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::StringOutputStream_*,_std::default_delete<google::protobuf::io::StringOutputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::StringOutputStream_*,_false>._M_head_impl =
       (StringOutputStream *)0x0;
  if (pSVar1 != (StringOutputStream *)0x0) {
    operator_delete(pSVar1,0x10);
  }
  pGVar2 = this->directory_;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[1],_true>
            (&local_98,&this->filename_,(char (*) [1])(anon_var_dwarf_a22956 + 5));
  absl::lts_20250127::container_internal::
  btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
  ::insert_unique<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>>
            (&local_48,
             (btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
              *)&pGVar2->files_,&local_98.first,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.second._M_dataplus._M_p != &local_98.second.field_2) {
    operator_delete(local_98.second._M_dataplus._M_p,
                    local_98.second.field_2._M_allocated_capacity + 1);
  }
  paVar10 = &local_98.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.first._M_dataplus._M_p != paVar10) {
    operator_delete(local_98.first._M_dataplus._M_p,
                    CONCAT71(local_98.first.field_2._M_allocated_capacity._1_7_,
                             local_98.first.field_2._M_local_buf[0]) + 1);
  }
  local_b8.node_ = local_48.first.node_;
  local_b8.position_ = local_48.first.position_;
  local_b8._12_4_ = local_48.first._12_4_;
  if ((this->insertion_point_)._M_string_length == 0) {
    if (local_48.second != false) {
      ppVar6 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
               ::operator*(&local_b8);
      std::__cxx11::string::swap((string *)&ppVar6->second);
      goto LAB_00d4cd40;
    }
    if (this->append_mode_ == true) {
      ppVar6 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
               ::operator*(&local_b8);
      std::__cxx11::string::_M_append((char *)&ppVar6->second,(ulong)(this->data_)._M_dataplus._M_p)
      ;
      goto LAB_00d4cd40;
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                        (this->filename_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,": Tried to write the same file twice.",0x25);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  else {
    insertion_content = &this->data_;
    sVar3 = (this->data_)._M_string_length;
    if ((sVar3 != 0) && ((insertion_content->_M_dataplus)._M_p[sVar3 - 1] != '\n')) {
      std::__cxx11::string::push_back((char)insertion_content);
    }
    if (local_48.second == false) {
      ppVar6 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
               ::operator*(&local_b8);
      local_e0 = (this->insertion_point_)._M_dataplus._M_p;
      local_e8 = (long *)(this->insertion_point_)._M_string_length;
      local_98.first._M_string_length = 0;
      local_98.first.field_2._M_local_buf[0] = '\0';
      format._M_str = (char *)&local_e8;
      format._M_len = (size_t)"@@protoc_insertion_point($0)";
      local_98.first._M_dataplus._M_p = (pointer)paVar10;
      absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)&local_98,(Nonnull<std::string_*>)&DAT_0000001c,format,
                 (Nullable<const_absl::string_view_*>)0x1,in_R9);
      pbVar11 = &ppVar6->second;
      uVar7 = std::__cxx11::string::find((char *)pbVar11,(ulong)local_98.first._M_dataplus._M_p,0);
      if (uVar7 == 0xffffffffffffffff) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                            (this->filename_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": insertion point \"",0x13);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(this->insertion_point_)._M_dataplus._M_p,
                            (this->insertion_point_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" not found.",0xc);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        this->directory_->had_error_ = true;
      }
      else {
        if (uVar7 < 4) {
LAB_00d4ca86:
          lVar8 = std::__cxx11::string::rfind((char)pbVar11,10);
          uVar7 = lVar8 + 1;
        }
        else {
          uVar7 = uVar7 - 3;
          std::__cxx11::string::substr((ulong)&local_e8,(ulong)pbVar11);
          iVar4 = std::__cxx11::string::compare((char *)&local_e8);
          if (local_e8 != local_d8) {
            operator_delete(local_e8,local_d8[0] + 1);
          }
          if (iVar4 != 0) goto LAB_00d4ca86;
        }
        lVar8 = std::__cxx11::string::find_first_not_of((char *)pbVar11,0x126783d,uVar7);
        std::__cxx11::string::string((string *)&local_e8,(string *)pbVar11,uVar7,lVar8 - uVar7);
        if (local_e0 == (pointer)0x0) {
          std::__cxx11::string::replace
                    ((ulong)pbVar11,uVar7,(char *)0x0,(ulong)(this->data_)._M_dataplus._M_p);
          insertion_length = (this->data_)._M_string_length;
          pcVar15 = (pointer)0x0;
        }
        else {
          sVar3 = (this->data_)._M_string_length;
          uVar17 = 0;
          if (sVar3 != 0) {
            sVar13 = 0;
            do {
              iVar4 = 0;
              if ((insertion_content->_M_dataplus)._M_p[sVar13] == '\n') {
                iVar4 = (int)local_e0;
              }
              uVar16 = (int)uVar17 + iVar4;
              uVar17 = (ulong)uVar16;
              sVar13 = sVar13 + 1;
            } while (sVar3 != sVar13);
            uVar17 = (ulong)(int)uVar16;
          }
          std::__cxx11::string::insert((ulong)pbVar11,uVar7,(char)sVar3 + (char)uVar17);
          pcVar14 = (pbVar11->_M_dataplus)._M_p;
          pcVar15 = pcVar14 + uVar7;
          if ((this->data_)._M_string_length == 0) {
            uVar9 = 0;
          }
          else {
            uVar12 = 0;
            local_c0 = insertion_content;
            local_a0 = pbVar11;
            do {
              memcpy(pcVar15,local_e8,(size_t)local_e0);
              pcVar15 = pcVar15 + (long)local_e0;
              lVar8 = std::__cxx11::string::find((char)local_c0,10);
              uVar18 = lVar8 + 1;
              memcpy(pcVar15,(this->data_)._M_dataplus._M_p + uVar12,uVar18 - uVar12);
              pcVar15 = pcVar15 + (uVar18 - uVar12);
              uVar9 = (this->data_)._M_string_length;
              uVar12 = uVar18;
            } while (uVar18 < uVar9);
            pcVar14 = (local_a0->_M_dataplus)._M_p;
            insertion_content = local_c0;
          }
          if (pcVar15 != pcVar14 + uVar17 + uVar9 + uVar7) {
            failure_msg = absl::lts_20250127::log_internal::
                          MakeCheckOpString<char_const*,char_const*>
                                    (pcVar15,pcVar14 + uVar17 + uVar9 + uVar7,
                                     "target_ptr == &(*target)[pos] + data_.size() + indent_size");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_58,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x3ab,failure_msg);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_58);
          }
          insertion_length = uVar9 + uVar17;
          pcVar15 = local_e0;
        }
        UpdateMetadata(this,insertion_content,uVar7,insertion_length,(size_t)pcVar15);
        if (local_e8 != local_d8) {
          operator_delete(local_e8,local_d8[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.first._M_dataplus._M_p != &local_98.first.field_2) {
        operator_delete(local_98.first._M_dataplus._M_p,
                        CONCAT71(local_98.first.field_2._M_allocated_capacity._1_7_,
                                 local_98.first.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_00d4cd40;
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                        (this->filename_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,": Tried to insert into file that doesn\'t exist.",0x2f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  this->directory_->had_error_ = true;
LAB_00d4cd40:
  GeneratedCodeInfo::~GeneratedCodeInfo(&this->info_to_insert_);
  pSVar1 = (this->inner_)._M_t.
           super___uniq_ptr_impl<google::protobuf::io::StringOutputStream,_std::default_delete<google::protobuf::io::StringOutputStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::io::StringOutputStream_*,_std::default_delete<google::protobuf::io::StringOutputStream>_>
           .super__Head_base<0UL,_google::protobuf::io::StringOutputStream_*,_false>._M_head_impl;
  if (pSVar1 != (StringOutputStream *)0x0) {
    operator_delete(pSVar1,0x10);
  }
  (this->inner_)._M_t.
  super___uniq_ptr_impl<google::protobuf::io::StringOutputStream,_std::default_delete<google::protobuf::io::StringOutputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::StringOutputStream_*,_std::default_delete<google::protobuf::io::StringOutputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::StringOutputStream_*,_false>._M_head_impl =
       (StringOutputStream *)0x0;
  pcVar15 = (this->data_)._M_dataplus._M_p;
  paVar10 = &(this->data_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar15 != paVar10) {
    operator_delete(pcVar15,paVar10->_M_allocated_capacity + 1);
  }
  pcVar15 = (this->insertion_point_)._M_dataplus._M_p;
  paVar10 = &(this->insertion_point_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar15 != paVar10) {
    operator_delete(pcVar15,paVar10->_M_allocated_capacity + 1);
  }
  pcVar15 = (this->filename_)._M_dataplus._M_p;
  paVar10 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar15 != paVar10) {
    operator_delete(pcVar15,paVar10->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

CommandLineInterface::MemoryOutputStream::~MemoryOutputStream() {
  // Make sure all data has been written.
  inner_.reset();

  // Insert into the directory.
  auto pair = directory_->files_.insert({filename_, ""});
  auto it = pair.first;
  bool already_present = !pair.second;

  if (insertion_point_.empty()) {
    // This was just a regular Open().
    if (already_present) {
      if (append_mode_) {
        it->second.append(data_);
      } else {
        std::cerr << filename_ << ": Tried to write the same file twice."
                  << std::endl;
        directory_->had_error_ = true;
      }
      return;
    }

    it->second.swap(data_);
    return;
  }
  // This was an OpenForInsert().

  // If the data doesn't end with a clean line break, add one.
  if (!data_.empty() && data_[data_.size() - 1] != '\n') {
    data_.push_back('\n');
  }

  // Find the file we are going to insert into.
  if (!already_present) {
    std::cerr << filename_ << ": Tried to insert into file that doesn't exist."
              << std::endl;
    directory_->had_error_ = true;
    return;
  }
  std::string* target = &it->second;

  // Find the insertion point.
  std::string magic_string =
      absl::Substitute("@@protoc_insertion_point($0)", insertion_point_);
  std::string::size_type pos = target->find(magic_string);

  if (pos == std::string::npos) {
    std::cerr << filename_ << ": insertion point \"" << insertion_point_
              << "\" not found." << std::endl;
    directory_->had_error_ = true;
    return;
  }

  if ((pos > 3) && (target->substr(pos - 3, 2) == "/*")) {
    // Support for inline "/* @@protoc_insertion_point() */"
    pos = pos - 3;
  } else {
    // Seek backwards to the beginning of the line, which is where we will
    // insert the data.  Note that this has the effect of pushing the
    // insertion point down, so the data is inserted before it.  This is
    // intentional because it means that multiple insertions at the same point
    // will end up in the expected order in the final output.
    pos = target->find_last_of('\n', pos);
    if (pos == std::string::npos) {
      // Insertion point is on the first line.
      pos = 0;
    } else {
      // Advance to character after '\n'.
      ++pos;
    }
  }

  // Extract indent.
  std::string indent_(*target, pos,
                      target->find_first_not_of(" \t", pos) - pos);

  if (indent_.empty()) {
    // No indent.  This makes things easier.
    target->insert(pos, data_);
    UpdateMetadata(data_, pos, data_.size(), 0);
    return;
  }
  // Calculate how much space we need.
  int indent_size = 0;
  for (size_t i = 0; i < data_.size(); ++i) {
    if (data_[i] == '\n') indent_size += indent_.size();
  }

  // Make a hole for it.
  target->insert(pos, data_.size() + indent_size, '\0');

  // Now copy in the data.
  std::string::size_type data_pos = 0;
  char* target_ptr = &(*target)[pos];
  while (data_pos < data_.size()) {
    // Copy indent.
    memcpy(target_ptr, indent_.data(), indent_.size());
    target_ptr += indent_.size();

    // Copy line from data_.
    // We already guaranteed that data_ ends with a newline (above), so this
    // search can't fail.
    std::string::size_type line_length =
        data_.find_first_of('\n', data_pos) + 1 - data_pos;
    memcpy(target_ptr, data_.data() + data_pos, line_length);
    target_ptr += line_length;
    data_pos += line_length;
  }

  ABSL_CHECK_EQ(target_ptr, &(*target)[pos] + data_.size() + indent_size);

  UpdateMetadata(data_, pos, data_.size() + indent_size, indent_.size());
}